

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btQuantizedBvh.cpp
# Opt level: O0

void __thiscall btQuantizedBvh::swapLeafNodes(btQuantizedBvh *this,int i,int splitIndex)

{
  unsigned_short uVar1;
  unsigned_short uVar2;
  unsigned_short uVar3;
  btQuantizedBvhNode *pbVar4;
  btQuantizedBvhNode *pbVar5;
  btOptimizedBvhNode *pbVar6;
  btOptimizedBvhNode *__dest;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  btOptimizedBvhNode tmp_1;
  btQuantizedBvhNode tmp;
  undefined1 local_60 [64];
  undefined8 local_20;
  undefined8 local_18;
  int local_10;
  int local_c;
  
  local_10 = in_EDX;
  local_c = in_ESI;
  if ((*(byte *)(in_RDI + 0x40) & 1) == 0) {
    pbVar6 = btAlignedObjectArray<btOptimizedBvhNode>::operator[]
                       ((btAlignedObjectArray<btOptimizedBvhNode> *)(in_RDI + 0x48),in_ESI);
    memcpy(local_60,pbVar6,0x40);
    pbVar6 = btAlignedObjectArray<btOptimizedBvhNode>::operator[]
                       ((btAlignedObjectArray<btOptimizedBvhNode> *)(in_RDI + 0x48),local_10);
    __dest = btAlignedObjectArray<btOptimizedBvhNode>::operator[]
                       ((btAlignedObjectArray<btOptimizedBvhNode> *)(in_RDI + 0x48),local_c);
    memcpy(__dest,pbVar6,0x40);
    pbVar6 = btAlignedObjectArray<btOptimizedBvhNode>::operator[]
                       ((btAlignedObjectArray<btOptimizedBvhNode> *)(in_RDI + 0x48),local_10);
    memcpy(pbVar6,local_60,0x40);
  }
  else {
    pbVar4 = btAlignedObjectArray<btQuantizedBvhNode>::operator[]
                       ((btAlignedObjectArray<btQuantizedBvhNode> *)(in_RDI + 0x88),in_ESI);
    local_20._0_2_ = pbVar4->m_quantizedAabbMin[0];
    local_20._2_2_ = pbVar4->m_quantizedAabbMin[1];
    local_20._4_2_ = pbVar4->m_quantizedAabbMin[2];
    local_20._6_2_ = pbVar4->m_quantizedAabbMax[0];
    local_18 = *(undefined8 *)(pbVar4->m_quantizedAabbMax + 1);
    pbVar4 = btAlignedObjectArray<btQuantizedBvhNode>::operator[]
                       ((btAlignedObjectArray<btQuantizedBvhNode> *)(in_RDI + 0x88),local_10);
    pbVar5 = btAlignedObjectArray<btQuantizedBvhNode>::operator[]
                       ((btAlignedObjectArray<btQuantizedBvhNode> *)(in_RDI + 0x88),local_c);
    uVar1 = pbVar4->m_quantizedAabbMin[1];
    uVar2 = pbVar4->m_quantizedAabbMin[2];
    uVar3 = pbVar4->m_quantizedAabbMax[0];
    pbVar5->m_quantizedAabbMin[0] = pbVar4->m_quantizedAabbMin[0];
    pbVar5->m_quantizedAabbMin[1] = uVar1;
    pbVar5->m_quantizedAabbMin[2] = uVar2;
    pbVar5->m_quantizedAabbMax[0] = uVar3;
    *(undefined8 *)(pbVar5->m_quantizedAabbMax + 1) =
         *(undefined8 *)(pbVar4->m_quantizedAabbMax + 1);
    pbVar4 = btAlignedObjectArray<btQuantizedBvhNode>::operator[]
                       ((btAlignedObjectArray<btQuantizedBvhNode> *)(in_RDI + 0x88),local_10);
    pbVar4->m_quantizedAabbMin[0] = (undefined2)local_20;
    pbVar4->m_quantizedAabbMin[1] = local_20._2_2_;
    pbVar4->m_quantizedAabbMin[2] = local_20._4_2_;
    pbVar4->m_quantizedAabbMax[0] = local_20._6_2_;
    *(undefined8 *)(pbVar4->m_quantizedAabbMax + 1) = local_18;
  }
  return;
}

Assistant:

void	btQuantizedBvh::swapLeafNodes(int i,int splitIndex)
{
	if (m_useQuantization)
	{
			btQuantizedBvhNode tmp = m_quantizedLeafNodes[i];
			m_quantizedLeafNodes[i] = m_quantizedLeafNodes[splitIndex];
			m_quantizedLeafNodes[splitIndex] = tmp;
	} else
	{
			btOptimizedBvhNode tmp = m_leafNodes[i];
			m_leafNodes[i] = m_leafNodes[splitIndex];
			m_leafNodes[splitIndex] = tmp;
	}
}